

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::HasGapAt(ON_PolyCurve *this,int segment_index)

{
  ON_Object *p;
  ON_Object *p_00;
  bool bVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  ON_ArcCurve *pOVar4;
  ON_ArcCurve *pOVar5;
  double dVar6;
  double dVar7;
  double local_b0;
  double local_a0;
  double d;
  double tol1;
  double tol0;
  double tol;
  ON_ArcCurve *arc1;
  ON_ArcCurve *arc0;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_Curve *c1;
  ON_Curve *c0;
  int count;
  int segment_index_local;
  ON_PolyCurve *this_local;
  
  iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  if ((-1 < segment_index) && (segment_index < iVar2 + -1)) {
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_index);
    p = (ON_Object *)*ppOVar3;
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_index + 1);
    p_00 = (ON_Object *)*ppOVar3;
    if ((p != (ON_Object *)0x0) && (p_00 != (ON_Object *)0x0)) {
      ON_Curve::PointAtEnd((ON_3dPoint *)&P1.z,(ON_Curve *)p);
      ON_Curve::PointAtStart((ON_3dPoint *)&arc0,(ON_Curve *)p_00);
      bVar1 = ON_PointsAreCoincident(3,false,&P1.z,(double *)&arc0);
      if (!bVar1) {
        pOVar4 = ON_ArcCurve::Cast(p);
        pOVar5 = ON_ArcCurve::Cast(p_00);
        if ((pOVar4 == (ON_ArcCurve *)0x0) && (pOVar5 == (ON_ArcCurve *)0x0)) {
          return true;
        }
        tol0 = 2.3283064365386963e-10;
        if (pOVar4 == (ON_ArcCurve *)0x0) {
          local_a0 = 0.0;
        }
        else {
          dVar7 = (pOVar4->m_arc).super_ON_Circle.radius;
          dVar6 = ON_Arc::AngleRadians(&pOVar4->m_arc);
          local_a0 = dVar7 * dVar6 * 1e-10;
        }
        if (pOVar5 == (ON_ArcCurve *)0x0) {
          local_b0 = 0.0;
        }
        else {
          dVar7 = (pOVar5->m_arc).super_ON_Circle.radius;
          dVar6 = ON_Arc::AngleRadians(&pOVar5->m_arc);
          local_b0 = dVar7 * dVar6 * 1e-10;
        }
        if (2.3283064365386963e-10 < local_a0) {
          tol0 = local_a0;
        }
        if (tol0 < local_b0) {
          tol0 = local_b0;
        }
        dVar7 = ON_3dPoint::DistanceTo((ON_3dPoint *)&P1.z,(ON_3dPoint *)&arc0);
        if (tol0 < dVar7) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_PolyCurve::HasGapAt(int segment_index) const
{
  const int count = m_segment.Count();

  if ( segment_index < 0 || segment_index >= count-1 )
    return 0;

  const ON_Curve* c0 = m_segment[segment_index];
  const ON_Curve* c1 = m_segment[segment_index+1];
  if ( 0 == c0 || 0 == c1 )
    return false;

  ON_3dPoint P0 = c0->PointAtEnd();
  ON_3dPoint P1 = c1->PointAtStart();
  // Note:  The point compare test should be the same
  //        as the one used in ON_Curve::IsClosed().
  //
  // June 2019 - sometime in the past decade ON_PolyCurve::HasGap()
  // changed and the test here is different from ON_Curve::IsClosed().
  // The initial "Note" no longer applies because it's no longer
  // clear why the current ON_PolyCurve::HasGap() eliminated the "b c"
  // test that remained in ON_Curve::IsClosed().

  if ( false == ON_PointsAreCoincident( 3, false, &P0.x, &P1.x ) )
  {
    // To fix RR 13325 I allow a little more leeway for arcs.
    const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(c0);
    const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(c1);
    if ( 0 == arc0 && 0 == arc1 )
      return true; // gap

    double tol = ON_ZERO_TOLERANCE;
    const double tol0 = arc0  ? ( arc0->m_arc.radius*arc0->m_arc.AngleRadians()*1.0e-10 ) : 0.0;
    const double tol1 = arc1  ? ( arc1->m_arc.radius*arc1->m_arc.AngleRadians()*1.0e-10 ) : 0.0;
    if ( tol < tol0 ) 
      tol = tol0;
    if ( tol < tol1 ) 
      tol = tol1;
    const double d = P0.DistanceTo(P1);
    if ( d > tol )
    {
      return true; // gap
    }
  }

  return false; // no gap
}